

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

void __thiscall Centaurus::StreamException::StreamException(StreamException *this,string *msg)

{
  string *msg_local;
  StreamException *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__StreamException_0028b530;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  return;
}

Assistant:

StreamException(const std::string& msg) noexcept
        : m_msg(msg)
    {
    }